

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunnerMain.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  Platform *pPVar2;
  char *logDirPath;
  exception *e;
  undefined1 local_150 [8];
  TestRunner runner;
  DirArchive archive;
  undefined1 local_68 [8];
  UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_> platform;
  ApiType local_48;
  CommandLine cmdLine;
  char **argv_local;
  int argc_local;
  
  cmdLine._40_8_ = argv;
  CommandLine::CommandLine((CommandLine *)&local_48);
  bVar1 = parseCommandLine((CommandLine *)&local_48,argc,(char **)cmdLine._40_8_);
  if (bVar1) {
    pPVar2 = createPlatform();
    de::DefaultDeleter<tcu::Platform>::DefaultDeleter
              ((DefaultDeleter<tcu::Platform> *)(archive.m_path.field_2._M_local_buf + 0xf));
    de::details::UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>::UniquePtr
              ((UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_> *)local_68,pPVar2);
    tcu::DirArchive::DirArchive
              ((DirArchive *)
               &runner.m_summary.runParams.
                super__Vector_base<glcts::TestRunParams,_std::allocator<glcts::TestRunParams>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,".");
    pPVar2 = de::details::UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>::get
                       ((UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_> *)local_68);
    logDirPath = (char *)std::__cxx11::string::c_str();
    glcts::TestRunner::TestRunner
              ((TestRunner *)local_150,pPVar2,
               (Archive *)
               &runner.m_summary.runParams.
                super__Vector_base<glcts::TestRunParams,_std::allocator<glcts::TestRunParams>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,logDirPath,local_48,
               cmdLine.dstLogDir.field_2._8_4_);
    do {
      bVar1 = glcts::TestRunner::iterate((TestRunner *)local_150);
    } while (bVar1);
    glcts::TestRunner::~TestRunner((TestRunner *)local_150);
    tcu::DirArchive::~DirArchive
              ((DirArchive *)
               &runner.m_summary.runParams.
                super__Vector_base<glcts::TestRunParams,_std::allocator<glcts::TestRunParams>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    de::details::UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>::~UniquePtr
              ((UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_> *)local_68);
    argv_local._4_4_ = 0;
  }
  else {
    printHelp(*(char **)cmdLine._40_8_);
    argv_local._4_4_ = -1;
  }
  platform.super_UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>.m_data._8_4_ = 1;
  CommandLine::~CommandLine((CommandLine *)&local_48);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
	CommandLine cmdLine;

	if (!parseCommandLine(cmdLine, argc, argv))
	{
		printHelp(argv[0]);
		return -1;
	}

	try
	{
		de::UniquePtr<tcu::Platform> platform(createPlatform());
		tcu::DirArchive				 archive(".");
		glcts::TestRunner runner(static_cast<tcu::Platform&>(*platform.get()), archive, cmdLine.dstLogDir.c_str(),
								 cmdLine.runType, cmdLine.flags);

		for (;;)
		{
			if (!runner.iterate())
				break;
		}
	}
	catch (const std::exception& e)
	{
		printf("ERROR: %s\n", e.what());
		return -1;
	}

	return 0;
}